

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

stref idx2::GetParentPath(stref *Path)

{
  str pcVar1;
  char *pcVar2;
  stref sVar3;
  char local_9;
  
  local_9 = '/';
  pcVar2 = FindLast<char*,char>
                     ((Path->field_0).Ptr + (long)Path->Size + -1,(Path->field_0).Ptr + -1,&local_9)
  ;
  pcVar1 = (Path->field_0).Ptr;
  if (pcVar2 == pcVar1 + -1) {
    sVar3.Size = Path->Size;
    sVar3.field_0.Ptr = pcVar1;
    sVar3._12_4_ = 0;
  }
  else {
    sVar3 = SubString(Path,0,(int)pcVar2 - (int)pcVar1);
  }
  return sVar3;
}

Assistant:

stref
GetParentPath(const stref& Path)
{
  idx2_Assert(!Contains(Path, '\\'));
  cstr LastSlash = FindLast(RevBegin(Path), RevEnd(Path), '/');
  if (LastSlash != RevEnd(Path))
    return SubString(Path, 0, int(LastSlash - Begin(Path)));

  return Path;
}